

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

Cnf_Dat_t * Jf_ManCreateCnfRemap(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas,int fAddOrCla)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  Cnf_Dat_t *pCVar4;
  int **ppiVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *pArray;
  int *piVar12;
  
  if (fAddOrCla != 0) {
    Vec_IntPush(vClas,vLits->nSize);
    pVVar3 = p->vCos;
    uVar7 = (ulong)(uint)pVVar3->nSize;
    if (p->nRegs < pVVar3->nSize) {
      lVar8 = 0;
      do {
        if ((int)uVar7 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = pVVar3->pArray[lVar8];
        if ((iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_007048ef;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Vec_IntPush(vLits,iVar9 * 2);
        lVar8 = lVar8 + 1;
        pVVar3 = p->vCos;
        uVar7 = (ulong)pVVar3->nSize;
      } while (lVar8 < (long)(uVar7 - (long)p->nRegs));
    }
  }
  iVar9 = vLits->nSize;
  if (0 < iVar9) {
    lVar8 = 0;
    do {
      if (vLits->pArray[lVar8] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar6 = (uint)vLits->pArray[lVar8] >> 1;
      if (p->nObjs <= (int)uVar6) goto LAB_007048ef;
      *(ulong *)(p->pObjs + uVar6) = *(ulong *)(p->pObjs + uVar6) | 0x40000000;
      lVar8 = lVar8 + 1;
      iVar9 = vLits->nSize;
    } while (lVar8 < iVar9);
  }
  uVar7 = (ulong)p->nObjs;
  __s = (int *)malloc(uVar7 * 4);
  memset(__s,0xff,uVar7 * 4);
  if ((long)uVar7 < 1) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    lVar8 = uVar7 * 3;
    do {
      if ((long)p->nObjs < (long)uVar7) {
LAB_007048ef:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)(&pGVar1[-1].field_0x0 + lVar8 * 4) >> 0x1e & 1) != 0) {
        *(ulong *)(&pGVar1[-1].field_0x0 + lVar8 * 4) =
             *(ulong *)(&pGVar1[-1].field_0x0 + lVar8 * 4) & 0xffffffffbfffffff;
        __s[uVar7 - 1] = iVar10;
        iVar10 = iVar10 + 1;
      }
      bVar2 = 1 < uVar7;
      uVar7 = uVar7 - 1;
      lVar8 = lVar8 + -3;
    } while (bVar2);
    iVar9 = vLits->nSize;
  }
  piVar12 = vLits->pArray;
  if (0 < iVar9) {
    lVar8 = 0;
    do {
      uVar6 = piVar12[lVar8];
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf7,"int Abc_Lit2LitV(int *, int)");
      }
      if (__s[uVar6 >> 1] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      piVar12[lVar8] = (uVar6 & 1) + __s[uVar6 >> 1] * 2;
      lVar8 = lVar8 + 1;
      iVar9 = vLits->nSize;
    } while (lVar8 < iVar9);
  }
  pCVar4 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar4->pMan = (Aig_Man_t *)p;
  pCVar4->nVars = iVar10;
  pCVar4->nLiterals = iVar9;
  iVar10 = vClas->nSize;
  pCVar4->nClauses = iVar10;
  ppiVar5 = (int **)malloc((long)iVar10 * 8 + 8);
  pCVar4->pClauses = ppiVar5;
  vLits->nCap = 0;
  vLits->nSize = 0;
  vLits->pArray = (int *)0x0;
  *ppiVar5 = piVar12;
  lVar8 = (long)vClas->nSize;
  if (lVar8 < 1) {
    lVar8 = 0;
  }
  else {
    piVar12 = vClas->pArray;
    lVar11 = 0;
    do {
      ppiVar5[lVar11] = *ppiVar5 + piVar12[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
    piVar12 = *ppiVar5;
  }
  ppiVar5[lVar8] = piVar12 + iVar9;
  pCVar4->pVarNums = __s;
  return pCVar4;
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnfRemap( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int i, Entry, * pMap, nVars = 0;
    if ( fAddOrCla )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vLits, Abc_Var2Lit(Gia_ObjId(p, pObj), 0) );
    }
    // label nodes present in the mapping
    Vec_IntForEachEntry( vLits, Entry, i )
        Gia_ManObj(p, Abc_Lit2Var(Entry))->fMark0 = 1;
    // create variable map
    pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjReverse( p, pObj, i )
        if ( pObj->fMark0 )
            pObj->fMark0 = 0, pMap[i] = nVars++;
    // relabel literals
    Vec_IntForEachEntry( vLits, Entry, i )
        Vec_IntWriteEntry( vLits, i, Abc_Lit2LitV(pMap, Entry) );
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums = pMap;
    return pCnf;
}